

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

AST * jsonnet::internal::left_recursive_deep(AST *ast_)

{
  AST *ast__00;
  
  do {
    ast__00 = ast_;
    ast_ = left_recursive(ast__00);
  } while (ast_ != (AST *)0x0);
  return ast__00;
}

Assistant:

static AST *left_recursive_deep(AST *ast_)
{
    AST *last = ast_;
    AST *left = left_recursive(ast_);

    while (left != nullptr) {
        last = left;
        left = left_recursive(last);
    }
    return last;
}